

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api.cpp
# Opt level: O2

RK_S32 vpu_api_init(VpuCodecContext *ctx,RK_U8 *extraData,RK_U32 extra_size)

{
  int iVar1;
  char *pcVar2;
  
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api","vpu_api_init in, extra_size: %d","vpu_api_init",extra_size);
  }
  if (ctx == (VpuCodecContext *)0x0) {
    pcVar2 = "vpu_api_init fail, input invalid";
  }
  else {
    if ((VpuApiLegacy *)ctx->vpuApiObj != (VpuApiLegacy *)0x0) {
      iVar1 = VpuApiLegacy::init((VpuApiLegacy *)ctx->vpuApiObj,(EVP_PKEY_CTX *)ctx);
      return iVar1;
    }
    pcVar2 = "vpu_api_init fail, vpu api invalid";
  }
  _mpp_log_l(4,"vpu_api",pcVar2,0);
  return -1;
}

Assistant:

static RK_S32
vpu_api_init(VpuCodecContext *ctx, RK_U8 *extraData, RK_U32 extra_size)
{
    vpu_api_dbg_func("vpu_api_init in, extra_size: %d", extra_size);

    if (ctx == NULL) {
        mpp_log("vpu_api_init fail, input invalid");
        return VPU_API_ERR_UNKNOW;
    }
    VpuApiLegacy* api = (VpuApiLegacy*)(ctx->vpuApiObj);
    if (api == NULL) {
        mpp_log("vpu_api_init fail, vpu api invalid");
        return VPU_API_ERR_UNKNOW;
    }

    return api->init(ctx, extraData, extra_size);
}